

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O1

Object * load_library(Object *__return_storage_ptr__,int c,Environment *env,char *s)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  Library *pLVar4;
  long lVar5;
  
  if (env != (Environment *)0x0) {
    s = get_string("x",c,env);
  }
  iVar1 = hasLib(s);
  if (iVar1 == 0) {
    pvVar2 = (void *)dlopen(s,1);
    if (pvVar2 == (void *)0x0) {
      uVar3 = dlerror();
      printf("\x1b[31m\n[Runtime Error] [Line:%d] %s\x1b[0m",c,uVar3);
      stop();
    }
    lVar5 = (long)libCount;
    libCount = (int)(lVar5 + 1);
    pLVar4 = (Library *)realloc(libraries,(lVar5 + 1) * 0x10);
    libraries = pLVar4;
    pLVar4[lVar5].name = s;
    pLVar4[lVar5].handle = pvVar2;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
  (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
  __return_storage_ptr__->type = OBJECT_NULL;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
  return __return_storage_ptr__;
}

Assistant:

static Object load_library(int c, Environment *env, char *s){
    if(env != NULL)
        s = get_string("x", c, env);

    if(hasLib(s))
        return nullObject;

    void *lib = dlopen(s, RTLD_LAZY);
    if(!lib){
        printf(runtime_error("%s"), c, dlerror());
        stop();
    }
    libCount++;
    libraries = (Library *)reallocate(libraries, sizeof(Library) * libCount);
    libraries[libCount - 1].name = s;
    libraries[libCount - 1].handle = lib;

    return nullObject;
}